

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O1

int SetFrame(int frame_num,WebPIterator *iter)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  
  puVar2 = (undefined8 *)iter->private_;
  if ((-1 < frame_num && puVar2 != (undefined8 *)0x0) &&
     (iVar1 = *(int *)((long)puVar2 + 0x44), frame_num <= iVar1)) {
    puVar7 = puVar2;
    if (frame_num == 0) {
      frame_num = iVar1;
    }
    do {
      puVar7 = (undefined8 *)puVar7[9];
      if (puVar7 == (undefined8 *)0x0) {
        return 0;
      }
    } while (*(int *)(puVar7 + 4) != frame_num);
    if (puVar7 != (undefined8 *)0x0) {
      lVar3 = puVar2[4];
      lVar9 = puVar7[5];
      sVar10 = puVar7[6];
      lVar4 = puVar7[8];
      if (lVar4 != 0) {
        if (lVar9 == 0) {
          lVar8 = 0;
        }
        else {
          lVar8 = lVar9 - (puVar7[7] + lVar4);
        }
        lVar9 = puVar7[7];
        sVar10 = lVar4 + sVar10 + lVar8;
      }
      if (lVar3 != 0) {
        iter->frame_num = *(int *)(puVar7 + 4);
        iter->num_frames = iVar1;
        uVar5 = *puVar7;
        uVar6 = puVar7[1];
        iter->x_offset = (int)uVar5;
        iter->y_offset = (int)((ulong)uVar5 >> 0x20);
        iter->width = (int)uVar6;
        iter->height = (int)((ulong)uVar6 >> 0x20);
        iter->has_alpha = *(int *)(puVar7 + 2);
        uVar5 = *(undefined8 *)((long)puVar7 + 0x14);
        iter->duration = (int)uVar5;
        iter->dispose_method = (int)((ulong)uVar5 >> 0x20);
        iter->blend_method = *(WebPMuxAnimBlend *)((long)puVar7 + 0x1c);
        iter->complete = *(int *)((long)puVar7 + 0x24);
        (iter->fragment).bytes = (uint8_t *)(lVar3 + lVar9);
        (iter->fragment).size = sVar10;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int SetFrame(int frame_num, WebPIterator* const iter) {
  const Frame* frame;
  const WebPDemuxer* const dmux = (WebPDemuxer*)iter->private_;
  if (dmux == NULL || frame_num < 0) return 0;
  if (frame_num > dmux->num_frames) return 0;
  if (frame_num == 0) frame_num = dmux->num_frames;

  frame = GetFrame(dmux, frame_num);
  if (frame == NULL) return 0;

  return SynthesizeFrame(dmux, frame, iter);
}